

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz77.c
# Opt level: O0

void ZopfliVerifyLenDist(uchar *data,size_t datasize,size_t pos,unsigned_short dist,
                        unsigned_short length)

{
  size_t i;
  unsigned_short length_local;
  unsigned_short dist_local;
  size_t pos_local;
  size_t datasize_local;
  uchar *data_local;
  
  for (i = 0; (i < length && (data[(pos - dist) + i] == data[pos + i])); i = i + 1) {
  }
  return;
}

Assistant:

void ZopfliVerifyLenDist(const unsigned char* data, size_t datasize, size_t pos,
                         unsigned short dist, unsigned short length) {

  /* TODO(lode): make this only run in a debug compile, it's for assert only. */
  size_t i;

  assert(pos + length <= datasize);
  for (i = 0; i < length; i++) {
    if (data[pos - dist + i] != data[pos + i]) {
      assert(data[pos - dist + i] == data[pos + i]);
      break;
    }
  }
}